

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# set.c
# Opt level: O2

void raviX_set_remove(Set *set,void *key)

{
  SetEntry *entry;
  
  entry = raviX_set_search(set,key);
  raviX_set_remove_entry(set,entry);
  return;
}

Assistant:

void raviX_set_remove(Set *set, const void *key)
{
	SetEntry *entry;

	entry = raviX_set_search(set, key);

	raviX_set_remove_entry(set, entry);
}